

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_move(int c,Fl_Text_Editor *e)

{
  int iVar1;
  Fl_Text_Buffer *pFVar2;
  int local_1c;
  int selected;
  int i;
  Fl_Text_Editor *e_local;
  int c_local;
  
  pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  iVar1 = Fl_Text_Buffer::selected(pFVar2);
  if (iVar1 == 0) {
    iVar1 = Fl_Text_Display::insert_position(&e->super_Fl_Text_Display);
    (e->super_Fl_Text_Display).dragPos = iVar1;
  }
  pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  Fl_Text_Buffer::unselect(pFVar2);
  Fl::copy((EVP_PKEY_CTX *)0x28311c,(EVP_PKEY_CTX *)0x0);
  switch(c) {
  case 0xff50:
    pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
    iVar1 = Fl_Text_Display::insert_position(&e->super_Fl_Text_Display);
    iVar1 = Fl_Text_Buffer::line_start(pFVar2,iVar1);
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,iVar1);
    break;
  case 0xff51:
    Fl_Text_Display::move_left(&e->super_Fl_Text_Display);
    break;
  case 0xff52:
    Fl_Text_Display::move_up(&e->super_Fl_Text_Display);
    break;
  case 0xff53:
    Fl_Text_Display::move_right(&e->super_Fl_Text_Display);
    break;
  case 0xff54:
    Fl_Text_Display::move_down(&e->super_Fl_Text_Display);
    break;
  case 0xff55:
    for (local_1c = 0; local_1c < (e->super_Fl_Text_Display).mNVisibleLines + -1;
        local_1c = local_1c + 1) {
      Fl_Text_Display::move_up(&e->super_Fl_Text_Display);
    }
    break;
  case 0xff56:
    for (local_1c = 0; local_1c < (e->super_Fl_Text_Display).mNVisibleLines + -1;
        local_1c = local_1c + 1) {
      Fl_Text_Display::move_down(&e->super_Fl_Text_Display);
    }
    break;
  case 0xff57:
    pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
    iVar1 = Fl_Text_Display::insert_position(&e->super_Fl_Text_Display);
    iVar1 = Fl_Text_Buffer::line_end(pFVar2,iVar1);
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,iVar1);
  }
  Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_move(int c, Fl_Text_Editor* e) {
  int i;
  int selected = e->buffer()->selected();
  if (!selected)
    e->dragPos = e->insert_position();
  e->buffer()->unselect();
  Fl::copy("", 0, 0);
  switch (c) {
  case FL_Home:
      e->insert_position(e->buffer()->line_start(e->insert_position()));
      break;
    case FL_End:
      e->insert_position(e->buffer()->line_end(e->insert_position()));
      break;
    case FL_Left:
      e->move_left();
      break;
    case FL_Right:
      e->move_right();
      break;
    case FL_Up:
      e->move_up();
      break;
    case FL_Down:
      e->move_down();
      break;
    case FL_Page_Up:
      for (i = 0; i < e->mNVisibleLines - 1; i++) e->move_up();
      break;
    case FL_Page_Down:
      for (i = 0; i < e->mNVisibleLines - 1; i++) e->move_down();
      break;
  }
  e->show_insert_position();
  return 1;
}